

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O1

void HMAC_SHA256_Init_Y(HMAC_SHA256_CTX_Y *ctx,void *_K,size_t Klen)

{
  size_t sVar1;
  uchar pad [64];
  uchar khash [32];
  byte local_88 [64];
  uchar local_48 [40];
  
  if (0x40 < Klen) {
    (ctx->ictx).count[0] = 0;
    (ctx->ictx).count[1] = 0;
    (ctx->ictx).state[0] = 0x6a09e667;
    (ctx->ictx).state[1] = 0xbb67ae85;
    (ctx->ictx).state[2] = 0x3c6ef372;
    (ctx->ictx).state[3] = 0xa54ff53a;
    (ctx->ictx).state[4] = 0x510e527f;
    (ctx->ictx).state[5] = 0x9b05688c;
    (ctx->ictx).state[6] = 0x1f83d9ab;
    (ctx->ictx).state[7] = 0x5be0cd19;
    SHA256_Update_Y(&ctx->ictx,_K,Klen);
    _K = local_48;
    SHA256_Final_Y((uchar *)_K,&ctx->ictx);
    Klen = 0x20;
  }
  (ctx->ictx).count[0] = 0;
  (ctx->ictx).count[1] = 0;
  (ctx->ictx).state[0] = 0x6a09e667;
  (ctx->ictx).state[1] = 0xbb67ae85;
  (ctx->ictx).state[2] = 0x3c6ef372;
  (ctx->ictx).state[3] = 0xa54ff53a;
  (ctx->ictx).state[4] = 0x510e527f;
  (ctx->ictx).state[5] = 0x9b05688c;
  (ctx->ictx).state[6] = 0x1f83d9ab;
  (ctx->ictx).state[7] = 0x5be0cd19;
  local_88[0x30] = 0x36;
  local_88[0x31] = 0x36;
  local_88[0x32] = 0x36;
  local_88[0x33] = 0x36;
  local_88[0x34] = 0x36;
  local_88[0x35] = 0x36;
  local_88[0x36] = 0x36;
  local_88[0x37] = 0x36;
  local_88[0x38] = 0x36;
  local_88[0x39] = 0x36;
  local_88[0x3a] = 0x36;
  local_88[0x3b] = 0x36;
  local_88[0x3c] = 0x36;
  local_88[0x3d] = 0x36;
  local_88[0x3e] = 0x36;
  local_88[0x3f] = 0x36;
  local_88[0x20] = 0x36;
  local_88[0x21] = 0x36;
  local_88[0x22] = 0x36;
  local_88[0x23] = 0x36;
  local_88[0x24] = 0x36;
  local_88[0x25] = 0x36;
  local_88[0x26] = 0x36;
  local_88[0x27] = 0x36;
  local_88[0x28] = 0x36;
  local_88[0x29] = 0x36;
  local_88[0x2a] = 0x36;
  local_88[0x2b] = 0x36;
  local_88[0x2c] = 0x36;
  local_88[0x2d] = 0x36;
  local_88[0x2e] = 0x36;
  local_88[0x2f] = 0x36;
  local_88[0x10] = 0x36;
  local_88[0x11] = 0x36;
  local_88[0x12] = 0x36;
  local_88[0x13] = 0x36;
  local_88[0x14] = 0x36;
  local_88[0x15] = 0x36;
  local_88[0x16] = 0x36;
  local_88[0x17] = 0x36;
  local_88[0x18] = 0x36;
  local_88[0x19] = 0x36;
  local_88[0x1a] = 0x36;
  local_88[0x1b] = 0x36;
  local_88[0x1c] = 0x36;
  local_88[0x1d] = 0x36;
  local_88[0x1e] = 0x36;
  local_88[0x1f] = 0x36;
  local_88[0] = 0x36;
  local_88[1] = 0x36;
  local_88[2] = 0x36;
  local_88[3] = 0x36;
  local_88[4] = 0x36;
  local_88[5] = 0x36;
  local_88[6] = 0x36;
  local_88[7] = 0x36;
  local_88[8] = 0x36;
  local_88[9] = 0x36;
  local_88[10] = 0x36;
  local_88[0xb] = 0x36;
  local_88[0xc] = 0x36;
  local_88[0xd] = 0x36;
  local_88[0xe] = 0x36;
  local_88[0xf] = 0x36;
  if (Klen != 0) {
    sVar1 = 0;
    do {
      local_88[sVar1] = local_88[sVar1] ^ *(byte *)((long)_K + sVar1);
      sVar1 = sVar1 + 1;
    } while (Klen != sVar1);
  }
  SHA256_Update_Y(&ctx->ictx,local_88,0x40);
  (ctx->octx).count[0] = 0;
  (ctx->octx).count[1] = 0;
  (ctx->octx).state[0] = 0x6a09e667;
  (ctx->octx).state[1] = 0xbb67ae85;
  (ctx->octx).state[2] = 0x3c6ef372;
  (ctx->octx).state[3] = 0xa54ff53a;
  (ctx->octx).state[4] = 0x510e527f;
  (ctx->octx).state[5] = 0x9b05688c;
  (ctx->octx).state[6] = 0x1f83d9ab;
  (ctx->octx).state[7] = 0x5be0cd19;
  local_88[0x30] = 0x5c;
  local_88[0x31] = 0x5c;
  local_88[0x32] = 0x5c;
  local_88[0x33] = 0x5c;
  local_88[0x34] = 0x5c;
  local_88[0x35] = 0x5c;
  local_88[0x36] = 0x5c;
  local_88[0x37] = 0x5c;
  local_88[0x38] = 0x5c;
  local_88[0x39] = 0x5c;
  local_88[0x3a] = 0x5c;
  local_88[0x3b] = 0x5c;
  local_88[0x3c] = 0x5c;
  local_88[0x3d] = 0x5c;
  local_88[0x3e] = 0x5c;
  local_88[0x3f] = 0x5c;
  local_88[0x20] = 0x5c;
  local_88[0x21] = 0x5c;
  local_88[0x22] = 0x5c;
  local_88[0x23] = 0x5c;
  local_88[0x24] = 0x5c;
  local_88[0x25] = 0x5c;
  local_88[0x26] = 0x5c;
  local_88[0x27] = 0x5c;
  local_88[0x28] = 0x5c;
  local_88[0x29] = 0x5c;
  local_88[0x2a] = 0x5c;
  local_88[0x2b] = 0x5c;
  local_88[0x2c] = 0x5c;
  local_88[0x2d] = 0x5c;
  local_88[0x2e] = 0x5c;
  local_88[0x2f] = 0x5c;
  local_88[0x10] = 0x5c;
  local_88[0x11] = 0x5c;
  local_88[0x12] = 0x5c;
  local_88[0x13] = 0x5c;
  local_88[0x14] = 0x5c;
  local_88[0x15] = 0x5c;
  local_88[0x16] = 0x5c;
  local_88[0x17] = 0x5c;
  local_88[0x18] = 0x5c;
  local_88[0x19] = 0x5c;
  local_88[0x1a] = 0x5c;
  local_88[0x1b] = 0x5c;
  local_88[0x1c] = 0x5c;
  local_88[0x1d] = 0x5c;
  local_88[0x1e] = 0x5c;
  local_88[0x1f] = 0x5c;
  local_88[0] = 0x5c;
  local_88[1] = 0x5c;
  local_88[2] = 0x5c;
  local_88[3] = 0x5c;
  local_88[4] = 0x5c;
  local_88[5] = 0x5c;
  local_88[6] = 0x5c;
  local_88[7] = 0x5c;
  local_88[8] = 0x5c;
  local_88[9] = 0x5c;
  local_88[10] = 0x5c;
  local_88[0xb] = 0x5c;
  local_88[0xc] = 0x5c;
  local_88[0xd] = 0x5c;
  local_88[0xe] = 0x5c;
  local_88[0xf] = 0x5c;
  if (Klen != 0) {
    sVar1 = 0;
    do {
      local_88[sVar1] = local_88[sVar1] ^ *(byte *)((long)_K + sVar1);
      sVar1 = sVar1 + 1;
    } while (Klen != sVar1);
  }
  SHA256_Update_Y(&ctx->octx,local_88,0x40);
  return;
}

Assistant:

void
HMAC_SHA256_Init_Y(HMAC_SHA256_CTX_Y * ctx, const void * _K, size_t Klen)
{
	unsigned char pad[64];
	unsigned char khash[32];
	const unsigned char * K = _K;
	size_t i;

	/* If Klen > 64, the key is really SHA256(K). */
	if (Klen > 64) {
		SHA256_Init_Y(&ctx->ictx);
		SHA256_Update_Y(&ctx->ictx, K, Klen);
		SHA256_Final_Y(khash, &ctx->ictx);
		K = khash;
		Klen = 32;
	}

	/* Inner SHA256 operation is SHA256(K xor [block of 0x36] || data). */
	SHA256_Init_Y(&ctx->ictx);
	memset(pad, 0x36, 64);
	for (i = 0; i < Klen; i++)
		pad[i] ^= K[i];
	SHA256_Update_Y(&ctx->ictx, pad, 64);

	/* Outer SHA256 operation is SHA256(K xor [block of 0x5c] || hash). */
	SHA256_Init_Y(&ctx->octx);
	memset(pad, 0x5c, 64);
	for (i = 0; i < Klen; i++)
		pad[i] ^= K[i];
	SHA256_Update_Y(&ctx->octx, pad, 64);

	/* Clean the stack. */
	memset(khash, 0, 32);
}